

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joystickmenu.cpp
# Opt level: O1

int __thiscall FOptionMenuItemJoyMap::GetSelection(FOptionMenuItemJoyMap *this)

{
  uint uVar1;
  FOptionValues *pFVar2;
  Node *pNVar3;
  int iVar4;
  Node *pNVar5;
  ulong uVar6;
  ulong uVar7;
  Pair *pPVar8;
  
  iVar4 = (*SELECTED_JOYSTICK->_vptr_IJoystickConfig[7])
                    (SELECTED_JOYSTICK,
                     (ulong)*(uint *)&(this->super_FOptionMenuItemOptionBase).field_0x34);
  uVar1 = *(uint *)&(this->super_FOptionMenuItemOptionBase).super_FOptionMenuItem.field_0x24;
  pNVar3 = OptionValues.Nodes + (OptionValues.Size - 1 & uVar1);
  while ((pNVar5 = pNVar3, pNVar5 != (Node *)0x0 && (pNVar5->Next != (Node *)0x1))) {
    pNVar3 = pNVar5->Next;
    if ((pNVar5->Pair).Key.Index == uVar1) {
LAB_00307094:
      if (((pNVar5 != (Node *)0x0) &&
          (pFVar2 = (pNVar5->Pair).Value, pFVar2 != (FOptionValues *)0x0)) &&
         (uVar6 = (ulong)(pFVar2->mValues).Count, uVar6 != 0)) {
        pPVar8 = (pFVar2->mValues).Array;
        uVar7 = 0;
        do {
          if (ABS((double)iVar4 - pPVar8->Value) < 1.1920928955078125e-07) {
            return (int)uVar7;
          }
          uVar7 = uVar7 + 1;
          pPVar8 = pPVar8 + 1;
        } while (uVar6 != uVar7);
      }
      return -1;
    }
  }
  pNVar5 = (Node *)0x0;
  goto LAB_00307094;
}

Assistant:

int GetSelection()
	{
		double f = SELECTED_JOYSTICK->GetAxisMap(mAxis);
		FOptionValues **opt = OptionValues.CheckKey(mValues);
		if (opt != NULL && *opt != NULL)
		{
			// Map from joystick axis to menu selection.
			for(unsigned i = 0; i < (*opt)->mValues.Size(); i++)
			{
				if (fabs(f - (*opt)->mValues[i].Value) < FLT_EPSILON)
				{
					return i;
				}
			}
		}
		return -1;
	}